

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_descriptor.h
# Opt level: O1

FormatDescriptor *
ktx::createFormatDescriptor
          (FormatDescriptor *__return_storage_ptr__,VkFormat vkFormat,Reporter *report)

{
  uint32_t *dfd;
  undefined1 auVar1 [12];
  string local_48;
  
  auVar1 = vk2dfd(vkFormat);
  dfd = auVar1._0_8_;
  if (dfd == (uint32_t *)0x0) {
    toString_abi_cxx11_(&local_48,(ktx *)(ulong)vkFormat,auVar1._8_4_);
    Reporter::fatal<char_const(&)[43],std::__cxx11::string>
              (report,DFD_FAILURE,(char (*) [43])"Failed to create format descriptor for: {}",
               &local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  createFormatDescriptor(__return_storage_ptr__,dfd);
  if (dfd != (uint32_t *)0x0) {
    free(dfd);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline FormatDescriptor createFormatDescriptor(VkFormat vkFormat, Reporter& report) {
    const auto dfd = std::unique_ptr<uint32_t[], decltype(std::free)*>(vk2dfd(vkFormat), std::free);
    if (!dfd)
        report.fatal(rc::DFD_FAILURE, "Failed to create format descriptor for: {}", toString(vkFormat));

    return createFormatDescriptor(dfd.get());
}